

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads_pthread.c
# Opt level: O0

int CRYPTO_THREAD_write_lock(CRYPTO_RWLOCK *lock)

{
  int iVar1;
  pthread_rwlock_t *in_RDI;
  uint local_4;
  
  iVar1 = pthread_rwlock_wrlock(in_RDI);
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

__owur int CRYPTO_THREAD_write_lock(CRYPTO_RWLOCK *lock)
{
# ifdef USE_RWLOCK
    if (pthread_rwlock_wrlock(lock) != 0)
        return 0;
# else
    if (pthread_mutex_lock(lock) != 0) {
        assert(errno != EDEADLK && errno != EBUSY);
        return 0;
    }
# endif

    return 1;
}